

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O1

void __thiscall
wasm::ABI::getStackSpace(ABI *this,Index local,Function *func,Index size,Module *wasm)

{
  pointer *this_00;
  Builder *ast;
  pointer puVar1;
  size_t sVar2;
  char *pcVar3;
  Expression **ppEVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Index index;
  Id index_00;
  Global *pGVar8;
  Module *this_01;
  Expression *pEVar9;
  LocalSet *pLVar10;
  Const *pCVar11;
  Binary *this_02;
  GlobalSet *pGVar12;
  Expression *pEVar13;
  Block *this_03;
  undefined4 *puVar14;
  undefined1 auVar15 [8];
  undefined4 in_register_0000000c;
  Module *pMVar16;
  Id index_01;
  undefined4 in_register_00000034;
  Builder *this_04;
  uintptr_t uVar17;
  MixedArena *this_05;
  ExpressionList *this_06;
  Signature SVar18;
  undefined1 local_228 [8];
  FindAllPointers<wasm::Return> finder;
  Builder local_38;
  Builder builder;
  
  this_04 = (Builder *)CONCAT44(in_register_00000034,local);
  pMVar16 = (Module *)CONCAT44(in_register_0000000c,size);
  pGVar8 = getStackPointerGlobal(pMVar16);
  if (pGVar8 == (Global *)0x0) {
    Fatal::Fatal((Fatal *)local_228);
    Fatal::operator<<((Fatal *)local_228,
                      (char (*) [48])"getStackSpace: failed to find the stack pointer");
    Fatal::~Fatal((Fatal *)local_228);
  }
  puVar1 = (pMVar16->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  index_01 = (Id)this;
  if (puVar1 == (pMVar16->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar17 = 2;
  }
  else {
    uVar17 = (((puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->indexType).id;
  }
  local_38.wasm = pMVar16;
  this_01 = (Module *)MixedArena::allocSpace(&pMVar16->allocator,0x40,8);
  *(Id *)&(this_01->exports).
          super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = BlockId;
  ((Type *)&(this_01->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)->id = 0;
  (this_01->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_01->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_01->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_01->globals).
  super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&pMVar16->allocator;
  this_00 = &(this_01->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sVar2 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar3 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_str;
  pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x20,8);
  pEVar9->_id = GlobalGetId;
  (pEVar9->type).id = 0;
  *(undefined8 *)(pEVar9 + 1) = 0;
  *(size_t *)(pEVar9 + 1) = sVar2;
  pEVar9[1].type.id = (uintptr_t)pcVar3;
  (pEVar9->type).id = uVar17;
  pLVar10 = Builder::makeLocalSet(&local_38,index_01,pEVar9);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
             (Expression *)pLVar10);
  if (uVar17 != 2) {
    handle_unreachable("unhandled pointerType",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/abi/stack.h"
                       ,0x44);
  }
  pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
  pEVar9->_id = LocalGetId;
  pEVar9[1]._id = index_01;
  (pEVar9->type).id = 2;
  pCVar11 = Builder::makeConst<int>(&local_38,(int)func + 0xfU & 0xfffffff0);
  this_02 = (Binary *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_02->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_02->op = SubInt32;
  this_02->left = pEVar9;
  this_02->right = (Expression *)pCVar11;
  Binary::finalize(this_02);
  sVar2 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_len;
  pcVar3 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_str;
  pGVar12 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
  (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id = GlobalSetId;
  (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
  (pGVar12->name).super_IString.str._M_len = 0;
  (pGVar12->name).super_IString.str._M_len = sVar2;
  (pGVar12->name).super_IString.str._M_str = pcVar3;
  pGVar12->value = (Expression *)this_02;
  GlobalSet::finalize(pGVar12);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
             (Expression *)pGVar12);
  ast = this_04 + 0xc;
  FindAllPointers<wasm::Return>::FindAllPointers
            ((FindAllPointers<wasm::Return> *)local_228,(Expression **)ast);
  auVar15 = local_228;
  while( true ) {
    if (auVar15 ==
        (undefined1  [8])
        finder.list.super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pMVar16 = ast->wasm;
      uVar17 = ((Type *)&(pMVar16->exports).
                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->id;
      if (uVar17 == 0) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                   (Expression *)pMVar16);
        sVar2 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar3 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = index_01;
        (pEVar9->type).id = 2;
        pGVar12 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
             GlobalSetId;
        (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
        (pGVar12->name).super_IString.str._M_len = 0;
        (pGVar12->name).super_IString.str._M_len = sVar2;
        (pGVar12->name).super_IString.str._M_str = pcVar3;
        pGVar12->value = pEVar9;
        GlobalSet::finalize(pGVar12);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                   (Expression *)pGVar12);
      }
      else if (uVar17 == 1) {
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                   (Expression *)pMVar16);
      }
      else {
        SVar18 = HeapType::getSignature((HeapType *)(this_04 + 7));
        auVar7._8_8_ = 0;
        auVar7._0_8_ = SVar18.results.id.id;
        index_00 = Builder::addVar(this_04,(Function *)0x0,(Name)(auVar7 << 0x40),(Type)wasm);
        pLVar10 = Builder::makeLocalSet(&local_38,index_00,(Expression *)ast->wasm);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                   (Expression *)pLVar10);
        sVar2 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_len;
        pcVar3 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_str;
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = index_01;
        (pEVar9->type).id = 2;
        pGVar12 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
        (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
             GlobalSetId;
        (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
        (pGVar12->name).super_IString.str._M_len = 0;
        (pGVar12->name).super_IString.str._M_len = sVar2;
        (pGVar12->name).super_IString.str._M_str = pcVar3;
        pGVar12->value = pEVar9;
        GlobalSet::finalize(pGVar12);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                   (Expression *)pGVar12);
        SVar18 = HeapType::getSignature((HeapType *)(this_04 + 7));
        pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
        pEVar9->_id = LocalGetId;
        pEVar9[1]._id = index_00;
        (pEVar9->type).id = SVar18.results.id.id;
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)this_00,
                   pEVar9);
      }
      Block::finalize((Block *)this_01);
      ast->wasm = this_01;
      if (local_228 != (undefined1  [8])0x0) {
        operator_delete((void *)local_228,
                        (long)finder.list.
                              super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_228);
      }
      return;
    }
    ppEVar4 = *(Expression ***)auVar15;
    pEVar9 = *ppEVar4;
    if (pEVar9->_id != ReturnId) break;
    if ((*(long *)(pEVar9 + 1) == 0) || (*(long *)(*(long *)(pEVar9 + 1) + 8) == 1)) {
      sVar2 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar3 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar13 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar13->_id = LocalGetId;
      pEVar13[1]._id = index_01;
      (pEVar13->type).id = 2;
      pGVar12 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar12->name).super_IString.str._M_len = 0;
      (pGVar12->name).super_IString.str._M_len = sVar2;
      (pGVar12->name).super_IString.str._M_str = pcVar3;
      pGVar12->value = pEVar13;
      GlobalSet::finalize(pGVar12);
      this_03 = Builder::makeBlock(&local_38,(Expression *)pGVar12);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&(this_03->list).
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar9)
      ;
      Block::finalize(this_03);
    }
    else {
      this_05 = &(local_38.wasm)->allocator;
      this_03 = (Block *)MixedArena::allocSpace(this_05,0x40,8);
      (this_03->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id = BlockId;
      (this_03->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id = 0;
      (this_03->name).super_IString.str._M_len = 0;
      (this_03->name).super_IString.str._M_str = (char *)0x0;
      (this_03->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      data = (Expression **)0x0;
      (this_03->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      usedElements = 0;
      (this_03->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
      allocatedElements = 0;
      (this_03->list).allocator = this_05;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(*(long *)(pEVar9 + 1) + 8);
      index = Builder::addVar(this_04,(Function *)0x0,(Name)(auVar6 << 0x40),(Type)wasm);
      pLVar10 = Builder::makeLocalSet(&local_38,index,*(Expression **)(pEVar9 + 1));
      this_06 = &this_03->list;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_06->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pLVar10);
      sVar2 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_len;
      pcVar3 = (pGVar8->super_Importable).super_Named.name.super_IString.str._M_str;
      pEVar13 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar13->_id = LocalGetId;
      pEVar13[1]._id = index_01;
      (pEVar13->type).id = 2;
      pGVar12 = (GlobalSet *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x28,8);
      (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
           GlobalSetId;
      (pGVar12->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
      (pGVar12->name).super_IString.str._M_len = 0;
      (pGVar12->name).super_IString.str._M_len = sVar2;
      (pGVar12->name).super_IString.str._M_str = pcVar3;
      pGVar12->value = pEVar13;
      GlobalSet::finalize(pGVar12);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_06->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                 (Expression *)pGVar12);
      uVar5 = *(undefined8 *)(*(long *)(pEVar9 + 1) + 8);
      puVar14 = (undefined4 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *puVar14 = 8;
      puVar14[4] = index;
      *(undefined8 *)(puVar14 + 2) = uVar5;
      pEVar9 = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      pEVar9->_id = ReturnId;
      (pEVar9->type).id = 0;
      *(undefined8 *)(pEVar9 + 1) = 0;
      (pEVar9->type).id = 1;
      *(undefined4 **)(pEVar9 + 1) = puVar14;
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (&this_06->
                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,pEVar9)
      ;
      Block::finalize(this_03);
    }
    *ppEVar4 = (Expression *)this_03;
    auVar15 = (undefined1  [8])((long)auVar15 + 8);
  }
  __assert_fail("int(_id) == int(T::SpecificId)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                ,0x314,"T *wasm::Expression::cast() [T = wasm::Return]");
}

Assistant:

inline void
getStackSpace(Index local, Function* func, Index size, Module& wasm) {
  auto* stackPointer = getStackPointerGlobal(wasm);
  if (!stackPointer) {
    Fatal() << "getStackSpace: failed to find the stack pointer";
  }
  // align the size
  size = stackAlign(size);
  auto pointerType =
    !wasm.memories.empty() ? wasm.memories[0]->indexType : Type::i32;
  // TODO: find existing stack usage, and add on top of that - carefully
  Builder builder(wasm);
  auto* block = builder.makeBlock();
  block->list.push_back(builder.makeLocalSet(
    local, builder.makeGlobalGet(stackPointer->name, pointerType)));
  // TODO: add stack max check
  Expression* added;
  if (pointerType == Type::i32) {
    // The stack goes downward in the LLVM wasm backend.
    added = builder.makeBinary(SubInt32,
                               builder.makeLocalGet(local, pointerType),
                               builder.makeConst(int32_t(size)));
  } else {
    WASM_UNREACHABLE("unhandled pointerType");
  }
  block->list.push_back(builder.makeGlobalSet(stackPointer->name, added));
  auto makeStackRestore = [&]() {
    return builder.makeGlobalSet(stackPointer->name,
                                 builder.makeLocalGet(local, pointerType));
  };
  // add stack restores to the returns
  FindAllPointers<Return> finder(func->body);
  for (auto** ptr : finder.list) {
    auto* ret = (*ptr)->cast<Return>();
    if (ret->value && ret->value->type != Type::unreachable) {
      // handle the returned value
      auto* block = builder.makeBlock();
      auto temp = builder.addVar(func, ret->value->type);
      block->list.push_back(builder.makeLocalSet(temp, ret->value));
      block->list.push_back(makeStackRestore());
      block->list.push_back(
        builder.makeReturn(builder.makeLocalGet(temp, ret->value->type)));
      block->finalize();
      *ptr = block;
    } else {
      // restore, then return
      *ptr = builder.makeSequence(makeStackRestore(), ret);
    }
  }
  // add stack restores to the body
  if (func->body->type == Type::none) {
    block->list.push_back(func->body);
    block->list.push_back(makeStackRestore());
  } else if (func->body->type == Type::unreachable) {
    block->list.push_back(func->body);
    // no need to restore the old stack value, we're gone anyhow
  } else {
    // save the return value
    auto temp = builder.addVar(func, func->getResults());
    block->list.push_back(builder.makeLocalSet(temp, func->body));
    block->list.push_back(makeStackRestore());
    block->list.push_back(builder.makeLocalGet(temp, func->getResults()));
  }
  block->finalize();
  func->body = block;
}